

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeblock.cpp
# Opt level: O2

CodeBlock * __thiscall cppgenerate::CodeBlock::addLine(CodeBlock *this,string *line)

{
  ostream *poVar1;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct((ulong)local_38,(char)this->m_indent);
  poVar1 = std::operator<<((ostream *)this,(string *)local_38);
  poVar1 = std::operator<<(poVar1,(string *)line);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)local_38);
  return this;
}

Assistant:

CodeBlock& CodeBlock::addLine( std::string line ){
    m_text << std::string( m_indent, ' ' ) << line << std::endl;

    return *this;
}